

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnmerge.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__filename;
  FILE *__stream;
  FILE *__stream_00;
  undefined8 *in_RSI;
  int in_EDI;
  char *binpath;
  char *parampath;
  int i;
  int model_count;
  int total_blob_count;
  int total_layer_count;
  FILE *outbinfp;
  FILE *outparamfp;
  char *outbinpath;
  char *outparampath;
  int *in_stack_00000820;
  int *in_stack_00000828;
  FILE *in_stack_00000830;
  char *in_stack_00000838;
  FILE *in_stack_00000fe0;
  char *in_stack_00000fe8;
  int local_40;
  int local_4;
  
  if ((in_EDI < 7) || ((in_EDI + -1) % 2 != 0)) {
    fprintf(_stderr,"Usage: %s [param1] [bin1] [param2] [bin2] ... [outparam] [outbin]\n",*in_RSI);
    local_4 = -1;
  }
  else {
    __filename = (char *)in_RSI[in_EDI + -1];
    __stream = fopen((char *)in_RSI[in_EDI + -2],"wb");
    __stream_00 = fopen(__filename,"wb");
    fprintf(__stream,"7767517\n");
    fprintf(__stream,"           \n");
    for (local_40 = 0; local_40 < (in_EDI + -3) / 2; local_40 = local_40 + 1) {
      copy_param(in_stack_00000838,in_stack_00000830,in_stack_00000828,in_stack_00000820);
      copy_bin(in_stack_00000fe8,in_stack_00000fe0);
    }
    rewind(__stream);
    fprintf(__stream,"7767517\n");
    fprintf(__stream,"%d %d",0,0);
    fclose(__stream);
    fclose(__stream_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 7 || (argc - 1) % 2 != 0)
    {
        fprintf(stderr, "Usage: %s [param1] [bin1] [param2] [bin2] ... [outparam] [outbin]\n", argv[0]);
        return -1;
    }

    const char* outparampath = argv[argc - 2];
    const char* outbinpath = argv[argc - 1];

    FILE* outparamfp = fopen(outparampath, "wb");
    FILE* outbinfp = fopen(outbinpath, "wb");

    // magic
    fprintf(outparamfp, "7767517\n");

    // layer count and blob count placeholder
    // 99999 is large enough I think  --- nihui
    fprintf(outparamfp, "           \n");

    int total_layer_count = 0;
    int total_blob_count = 0;

    const int model_count = (argc - 3) / 2;

    for (int i = 0; i < model_count; i++)
    {
        const char* parampath = argv[i * 2 + 1];
        const char* binpath = argv[i * 2 + 2];

        copy_param(parampath, outparamfp, &total_layer_count, &total_blob_count);
        copy_bin(binpath, outbinfp);
    }

    // the real layer count and blob count
    rewind(outparamfp);
    fprintf(outparamfp, "7767517\n");
    fprintf(outparamfp, "%d %d", total_layer_count, total_blob_count);

    fclose(outparamfp);
    fclose(outbinfp);

    return 0;
}